

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugManager.cpp
# Opt level: O3

void __thiscall
AutoSetDispatchHaltFlag::AutoSetDispatchHaltFlag
          (AutoSetDispatchHaltFlag *this,ScriptContext *scriptContext,ThreadContext *threadContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DebugManager *pDVar4;
  
  this->m_scriptContext = scriptContext;
  this->m_threadContext = threadContext;
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                       ,0xdb,"(m_scriptContext != nullptr)","m_scriptContext != nullptr");
    if (!bVar2) goto LAB_008aa2c2;
    *puVar3 = 0;
    threadContext = this->m_threadContext;
  }
  if (threadContext == (ThreadContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                       ,0xdc,"(m_threadContext != nullptr)","m_threadContext != nullptr");
    if (!bVar2) goto LAB_008aa2c2;
    *puVar3 = 0;
    threadContext = this->m_threadContext;
  }
  pDVar4 = threadContext->debugManager;
  if (pDVar4->isAtDispatchHalt == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                       ,0xde,"(!m_threadContext->GetDebugManager()->IsAtDispatchHalt())",
                       "!m_threadContext->GetDebugManager()->IsAtDispatchHalt()");
    if (!bVar2) {
LAB_008aa2c2:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pDVar4 = this->m_threadContext->debugManager;
  }
  pDVar4->isAtDispatchHalt = true;
  Js::ScriptContext::GetDebugContext(this->m_scriptContext);
}

Assistant:

AutoSetDispatchHaltFlag::AutoSetDispatchHaltFlag(Js::ScriptContext *scriptContext, ThreadContext *threadContext) :
    m_scriptContext(scriptContext),
    m_threadContext(threadContext)
{
    Assert(m_scriptContext != nullptr);
    Assert(m_threadContext != nullptr);

    Assert(!m_threadContext->GetDebugManager()->IsAtDispatchHalt());
    m_threadContext->GetDebugManager()->SetDispatchHalt(true);

    Assert(!m_scriptContext->GetDebugContext()->GetProbeContainer()->IsPrimaryBrokenToDebuggerContext());
    m_scriptContext->GetDebugContext()->GetProbeContainer()->SetIsPrimaryBrokenToDebuggerContext(true);
}